

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3Fts5Mprintf(int *pRc,char *zFmt,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  __va_list_tag local_28;
  long local_10;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (*pRc == 0) {
    local_28.gp_offset = 0x10;
    local_28.fp_offset = 0x30;
    local_28.overflow_arg_area = &stack0x00000008;
    local_28.reg_save_area = auStack_d8;
    pcVar1 = sqlite3_vmprintf(zFmt,&local_28);
    if (pcVar1 == (char *)0x0) {
      *pRc = 7;
    }
  }
  else {
    pcVar1 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pcVar1;
  }
  __stack_chk_fail();
}

Assistant:

static char *sqlite3Fts5Mprintf(int *pRc, const char *zFmt, ...){
  char *zRet = 0;
  if( *pRc==SQLITE_OK ){
    va_list ap;
    va_start(ap, zFmt);
    zRet = sqlite3_vmprintf(zFmt, ap);
    va_end(ap);
    if( zRet==0 ){
      *pRc = SQLITE_NOMEM;
    }
  }
  return zRet;
}